

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
          (EpsCopyOutputStream *this,uint8_t *ptr)

{
  LogMessage *pLVar1;
  LogMessage local_78;
  Voidify local_62;
  byte local_61;
  LogMessage local_60;
  Voidify local_4d [20];
  byte local_39;
  LogMessage local_38;
  Voidify local_25;
  int local_24;
  uint8_t *puStack_20;
  int overrun;
  uint8_t *ptr_local;
  EpsCopyOutputStream *this_local;
  
  puStack_20 = ptr;
  ptr_local = (uint8_t *)this;
  while( true ) {
    if ((this->had_error_ & 1U) != 0) {
      return this->buffer_;
    }
    local_24 = (int)puStack_20 - (int)this->end_;
    local_39 = 0;
    if (local_24 < 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x376,"overrun >= 0");
      local_39 = 1;
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_25,pLVar1);
    }
    if ((local_39 & 1) != 0) break;
    local_61 = 0;
    if (0x10 < local_24) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x377,"overrun <= kSlopBytes");
      local_61 = 1;
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      absl::lts_20250127::log_internal::Voidify::operator&&(local_4d,pLVar1);
    }
    if ((local_61 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    }
    puStack_20 = Next(this);
    puStack_20 = puStack_20 + local_24;
    if (puStack_20 < this->end_) {
      if (puStack_20 < this->end_) {
        return puStack_20;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x37a,"ptr < end_");
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_62,pLVar1);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_78);
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

uint8_t* EpsCopyOutputStream::EnsureSpaceFallback(uint8_t* ptr) {
  do {
    if (ABSL_PREDICT_FALSE(had_error_)) return buffer_;
    int overrun = ptr - end_;
    ABSL_DCHECK(overrun >= 0);           // NOLINT
    ABSL_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
  } while (ptr >= end_);
  ABSL_DCHECK(ptr < end_);  // NOLINT
  return ptr;
}